

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

pair<int,_int> __thiscall Game::calculateLastRoundPoints(Game *this,Round *r,bool lastRound)

{
  bool bVar1;
  int iVar2;
  CardValue CVar3;
  Suit SVar4;
  ulong __n;
  vector<Card,_std::allocator<Card>_> *pvVar5;
  const_reference pvVar6;
  ulong local_68;
  size_t j;
  Card cj;
  Card playedCard;
  size_t playerID;
  size_t i;
  int gamePoints;
  int rawCardPoints;
  size_t winner;
  size_t startingPlayer;
  Round *pRStack_20;
  bool lastRound_local;
  Round *r_local;
  Game *this_local;
  
  startingPlayer._7_1_ = lastRound;
  pRStack_20 = r;
  r_local = (Round *)this;
  winner = Round::getStartPosition(r);
  _gamePoints = Round::getWinner(r);
  i._4_4_ = 0;
  i._0_4_ = 0;
  for (playerID = 0; playerID < 4; playerID = playerID + 1) {
    __n = playerID + winner & 3;
    pvVar5 = Round::playedCards(r);
    pvVar6 = std::vector<Card,_std::allocator<Card>_>::at(pvVar5,__n);
    cj = *pvVar6;
    iVar2 = Ruleset::getValue(&this->m_rules,&cj);
    i._4_4_ = iVar2 + i._4_4_;
    CVar3 = Card::value(&cj);
    if (((CVar3 == ASS) && (SVar4 = Card::suit(&cj), SVar4 == DIAMONDS)) &&
       (bVar1 = teamMembers(this,__n,_gamePoints), !bVar1)) {
      i._0_4_ = (int)i + 1;
    }
    if ((startingPlayer._7_1_ & 1) != 0) {
      Card::Card((Card *)&j,CLUBS,JACK);
      pvVar5 = Round::playedCards(r);
      pvVar6 = std::vector<Card,_std::allocator<Card>_>::at(pvVar5,_gamePoints);
      bVar1 = Card::operator==(pvVar6,(Card *)&j);
      if (bVar1) {
        i._0_4_ = (int)i + 1;
      }
      for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
        bVar1 = teamMembers(this,local_68,_gamePoints);
        if (!bVar1) {
          pvVar5 = Round::playedCards(r);
          pvVar6 = std::vector<Card,_std::allocator<Card>_>::at(pvVar5,local_68);
          bVar1 = Card::operator==(pvVar6,(Card *)&j);
          if (bVar1) {
            i._0_4_ = (int)i + 1;
          }
        }
      }
    }
  }
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            ((pair<int,_int> *)&this_local,(int *)((long)&i + 4),(int *)&i);
  return (pair<int,_int>)this_local;
}

Assistant:

std::pair<int, int> Game::calculateLastRoundPoints(Round r, bool lastRound) {
    size_t startingPlayer = r.getStartPosition();
    size_t winner = r.getWinner();

    int rawCardPoints = 0;
    int gamePoints = 0;
    for (size_t i = 0; i < NUMPLAYERS; i++) {
        size_t playerID = (i + startingPlayer) % NUMPLAYERS;
        Card playedCard = r.playedCards().at(playerID);
        rawCardPoints += m_rules.getValue(playedCard);

        //Catch fox
        if (playedCard.value() == CardValue::ASS && playedCard.suit() == Suit::DIAMONDS) {
            if (!teamMembers(playerID, winner))
                ++gamePoints;
        }
        //Catch CJ and win with it
        if (lastRound) {
            Card cj = Card(Suit::CLUBS, CardValue::JACK);
            if (r.playedCards().at(winner) == cj) //win with it
                ++gamePoints;
            for (size_t j = 0; j < NUMPLAYERS; j++) { //catch it
                if (!teamMembers(j, winner)) {
                    if (r.playedCards().at(j) == cj)
                        ++gamePoints;
                }
            }
        }

    }
    return std::pair<int, int>(rawCardPoints, gamePoints);

}